

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * Cudd_zddDiffConst(DdManager *zdd,DdNode *P,DdNode *Q)

{
  DdManager *pDVar1;
  DdManager *pDVar2;
  DdManager *table;
  DdNode *res;
  DdNode *t;
  DdNode *empty;
  int q_top;
  int p_top;
  DdNode *Q_local;
  DdNode *P_local;
  DdManager *zdd_local;
  
  pDVar1 = (DdManager *)zdd->zero;
  zdd_local = pDVar1;
  if (((((DdManager *)P != pDVar1) && (zdd_local = (DdManager *)P, (DdManager *)Q != pDVar1)) &&
      (zdd_local = pDVar1, P != Q)) &&
     (zdd_local = (DdManager *)cuddCacheLookup2Zdd(zdd,cuddZddDiff,P,Q),
     zdd_local == (DdManager *)0x0)) {
    if (P->index == 0x7fffffff) {
      empty._4_4_ = P->index;
    }
    else {
      empty._4_4_ = zdd->permZ[P->index];
    }
    if (Q->index == 0x7fffffff) {
      empty._0_4_ = Q->index;
    }
    else {
      empty._0_4_ = zdd->permZ[Q->index];
    }
    if ((int)empty._4_4_ < (int)(DdHalfWord)empty) {
      table = (DdManager *)0x1;
    }
    else if ((int)(DdHalfWord)empty < (int)empty._4_4_) {
      table = (DdManager *)Cudd_zddDiffConst(zdd,P,(Q->type).kids.E);
    }
    else {
      pDVar2 = (DdManager *)Cudd_zddDiffConst(zdd,(P->type).kids.T,(Q->type).kids.T);
      if (pDVar2 == pDVar1) {
        table = (DdManager *)Cudd_zddDiffConst(zdd,(P->type).kids.E,(Q->type).kids.E);
      }
      else {
        table = (DdManager *)0x1;
      }
    }
    cuddCacheInsert2(zdd,cuddZddDiff,P,Q,&table->sentinel);
    zdd_local = table;
  }
  return &zdd_local->sentinel;
}

Assistant:

DdNode *
Cudd_zddDiffConst(
  DdManager * zdd,
  DdNode * P,
  DdNode * Q)
{
    int         p_top, q_top;
    DdNode      *empty = DD_ZERO(zdd), *t, *res;
    DdManager   *table = zdd;

    statLine(zdd);
    if (P == empty)
        return(empty);
    if (Q == empty)
        return(P);
    if (P == Q)
        return(empty);

    /* Check cache.  The cache is shared by cuddZddDiff(). */
    res = cuddCacheLookup2Zdd(table, cuddZddDiff, P, Q);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P))
        p_top = P->index;
    else
        p_top = zdd->permZ[P->index];
    if (cuddIsConstant(Q))
        q_top = Q->index;
    else
        q_top = zdd->permZ[Q->index];
    if (p_top < q_top) {
        res = DD_NON_CONSTANT;
    } else if (p_top > q_top) {
        res = Cudd_zddDiffConst(zdd, P, cuddE(Q));
    } else {
        t = Cudd_zddDiffConst(zdd, cuddT(P), cuddT(Q));
        if (t != empty)
            res = DD_NON_CONSTANT;
        else
            res = Cudd_zddDiffConst(zdd, cuddE(P), cuddE(Q));
    }

    cuddCacheInsert2(table, cuddZddDiff, P, Q, res);

    return(res);

}